

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O1

int gutil::Thread::getProcessingUnits(void)

{
  int iVar1;
  long lVar2;
  char *__nptr;
  int iVar3;
  
  if ((anonymous_namespace)::procunits < 1) {
    lVar2 = sysconf(0x53);
    (anonymous_namespace)::procunits = (int)lVar2;
    if ((anonymous_namespace)::procunits < 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot determine number of CPUs, assuming one!",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      (anonymous_namespace)::procunits = 1;
    }
    __nptr = getenv("CVKIT_MAX_THREADS");
    if (__nptr != (char *)0x0) {
      iVar1 = atoi(__nptr);
      iVar3 = 1;
      if (1 < iVar1) {
        iVar3 = iVar1;
      }
      if (iVar3 < (anonymous_namespace)::procunits) {
        (anonymous_namespace)::procunits = iVar3;
      }
    }
  }
  return (anonymous_namespace)::procunits;
}

Assistant:

int Thread::getProcessingUnits()
{
  if (procunits <= 0)
  {
#ifdef _SC_NPROCESSORS_CONF
    procunits=sysconf(_SC_NPROCESSORS_CONF);
#endif

    if (procunits <= 0)
    {
      std::cerr << "Cannot determine number of CPUs, assuming one!" << std::endl;
      procunits=1;
    }

    const char *s=std::getenv("CVKIT_MAX_THREADS");

    if (s != 0)
    {
      int n=std::max(1, std::atoi(s));

      if (n < procunits)
      {
        procunits=n;
      }
    }
  }

  return procunits;
}